

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

LoadFileStatus lf_load_fp(LoadedFile *lf,FILE *fp)

{
  int iVar1;
  size_t sVar2;
  ptrlen data;
  LoadFileStatus local_2c;
  LoadFileStatus status;
  size_t retd;
  FILE *fp_local;
  LoadedFile *lf_local;
  
  lf->len = 0;
  while (lf->len < lf->max_size) {
    sVar2 = fread(lf->data + lf->len,1,lf->max_size - lf->len,(FILE *)fp);
    iVar1 = ferror((FILE *)fp);
    if (iVar1 != 0) {
      return LF_ERROR;
    }
    if (sVar2 == 0) break;
    lf->len = sVar2 + lf->len;
  }
  local_2c = LF_OK;
  if (lf->len == lf->max_size) {
    iVar1 = fgetc((FILE *)fp);
    local_2c = (LoadFileStatus)(iVar1 != -1);
  }
  data = make_ptrlen(lf->data,lf->len);
  BinarySource_INIT__(lf->binarysource_,data);
  return local_2c;
}

Assistant:

LoadFileStatus lf_load_fp(LoadedFile *lf, FILE *fp)
{
    lf->len = 0;
    while (lf->len < lf->max_size) {
        size_t retd = fread(lf->data + lf->len, 1, lf->max_size - lf->len, fp);
        if (ferror(fp))
            return LF_ERROR;

        if (retd == 0)
            break;

        lf->len += retd;
    }

    LoadFileStatus status = LF_OK;

    if (lf->len == lf->max_size) {
        /* The file might be too long to fit in our fixed-size
         * structure. Try reading one more byte, to check. */
        if (fgetc(fp) != EOF)
            status = LF_TOO_BIG;
    }

    BinarySource_INIT(lf, lf->data, lf->len);

    return status;
}